

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O1

TableauPile * __thiscall solitaire::Solitaire::getTableauPile(Solitaire *this,PileId *id)

{
  PileId local_14;
  
  throwExceptionOnInvalidTableauPileId(this,&local_14);
  return (this->tableauPiles)._M_elems[id->t].
         super___shared_ptr<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
}

Assistant:

const TableauPile& Solitaire::getTableauPile(const PileId id) const {
    throwExceptionOnInvalidTableauPileId(id);
    return *tableauPiles[id];
}